

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>_>
     ::set_arrays(size_t *param_1)

{
  size_t groups_size_00;
  pointer ppVar1;
  value_type *pvVar2;
  pointer pgVar3;
  group_type *pgVar4;
  uchar *p;
  allocator_type sal;
  size_t groups_size;
  size_t groups_size_index;
  size_type in_stack_ffffffffffffffb8;
  StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>
  *in_stack_ffffffffffffffc0;
  
  groups_size_00 = pow2_size_policy::size(*param_1);
  buffer_size(groups_size_00);
  ppVar1 = std::
           allocator_traits<slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>_>
           ::allocate(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  param_1[3] = (size_t)ppVar1;
  pvVar2 = elements((table_arrays<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>_>
                     *)0xb6c476);
  pgVar3 = std::
           pointer_traits<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*>
           ::pointer_to((__make_not_void<element_type>_conflict7 *)
                        ((long)&pvVar2[groups_size_00 * 0xf + -1].first.value.
                                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        + (0x10U - (long)(pvVar2 + groups_size_00 * 0xf + -1) & 0xf)));
  param_1[2] = (size_t)pgVar3;
  pgVar4 = groups((table_arrays<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>_>
                   *)0xb6c4c7);
  initialize_groups(pgVar4,groups_size_00);
  groups((table_arrays<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_slang::SourceRange>,_448UL,_16UL>_>
          *)0xb6c4de);
  group15<boost::unordered::detail::foa::plain_integral>::set_sentinel
            ((group15<boost::unordered::detail::foa::plain_integral> *)0xb6c4f6);
  return;
}

Assistant:

static void set_arrays(table_arrays& arrays, allocator_type al, std::size_t,
                           std::false_type /* always allocate */) {
        using storage_traits = std::allocator_traits<allocator_type>;
        auto groups_size_index = arrays.groups_size_index;
        auto groups_size = size_policy::size(groups_size_index);

        auto sal = allocator_type(al);
        arrays.elements_ = storage_traits::allocate(sal, buffer_size(groups_size));

        /* Align arrays.groups to sizeof(group_type). table_iterator critically
         * depends on such alignment for its increment operation.
         */

        auto p = reinterpret_cast<unsigned char*>(arrays.elements() + groups_size * N - 1);
        p += (uintptr_t(sizeof(group_type)) - reinterpret_cast<uintptr_t>(p)) % sizeof(group_type);
        arrays.groups_ = group_type_pointer_traits::pointer_to(*reinterpret_cast<group_type*>(p));

        initialize_groups(arrays.groups(), groups_size,
                          is_trivially_default_constructible<group_type>{});
        arrays.groups()[groups_size - 1].set_sentinel();
    }